

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BindImageMemory::prepare(BindImageMemory *this,PrepareContext *context)

{
  DeviceInterface *pDVar1;
  VkResult result;
  
  pDVar1 = context->m_context->m_vkd;
  result = (*pDVar1->_vptr_DeviceInterface[0xd])
                     (pDVar1,context->m_context->m_device,
                      (context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data
                      .object.m_internal,
                      (context->m_memory->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.
                      m_data.object.m_internal,0);
  ::vk::checkResult(result,
                    "vkd.bindImageMemory(device, context.getImage(), context.getMemory().getMemory(), 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x6b5);
  return;
}

Assistant:

void BindImageMemory::prepare (PrepareContext& context)
{
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice				device			= context.getContext().getDevice();

	VK_CHECK(vkd.bindImageMemory(device, context.getImage(), context.getMemory().getMemory(), 0));
}